

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_functional.h
# Opt level: O1

void __thiscall
mp::
BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>
::BasicFCC(BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>
           *this,FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 *cvt,
          CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
          *fc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  pointer pdVar5;
  double dVar6;
  Context CVar7;
  
  this->converter_ = cvt;
  paVar1 = &(this->constr_).super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
  (this->constr_).super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
       (pointer)paVar1;
  pcVar3 = (fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_dataplus._M_p;
  paVar2 = &(fc->super_FunctionalConstraint).super_BasicConstraint.name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)
             ((long)&(fc->super_FunctionalConstraint).super_BasicConstraint.name_.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)
     ((long)&(this->constr_).super_FunctionalConstraint.super_BasicConstraint.name_.field_2 + 8) =
         uVar4;
  }
  else {
    (this->constr_).super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p = pcVar3
    ;
    (this->constr_).super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
    _M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->constr_).super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length =
       (fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_string_length;
  (fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar2;
  (fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_string_length = 0;
  (fc->super_FunctionalConstraint).super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
  CVar7.value_ = (fc->super_FunctionalConstraint).ctx.value_;
  (this->constr_).super_FunctionalConstraint.result_var_ =
       (fc->super_FunctionalConstraint).result_var_;
  (this->constr_).super_FunctionalConstraint.ctx = (Context)CVar7.value_;
  (this->constr_).super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.args_.
  _M_elems[0] = (fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).
                args_._M_elems[0];
  pdVar5 = *(pointer *)
            ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                    ).params_.pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data + 8);
  (this->constr_).super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
  params_.pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_.
       pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->constr_).
           super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
           breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 8) = pdVar5;
  *(pointer *)
   ((long)&(this->constr_).
           super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
           breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 0x10) =
       *(pointer *)
        ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).
                params_.pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data + 0x10);
  *(pointer *)
   ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_
           .pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_.pls_.
  breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_
           .pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  pdVar5 = *(pointer *)
            ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                    ).params_.pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data + 8);
  (this->constr_).super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
  params_.pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_.
       pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->constr_).
           super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
           slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 8) = pdVar5;
  *(pointer *)
   ((long)&(this->constr_).
           super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
           slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 0x10) =
       *(pointer *)
        ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).
                params_.pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data + 0x10);
  *(pointer *)
   ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_
           .pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_.pls_.
  slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_
           .pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  dVar6 = (fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_.
          pls_.Y0_;
  (this->constr_).super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
  params_.pls_.X0_ =
       (fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_.
       pls_.X0_;
  (this->constr_).super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
  params_.pls_.Y0_ = dVar6;
  pdVar5 = *(pointer *)
            ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                    ).params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data + 8);
  (this->constr_).super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
  params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_.
       plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start;
  *(pointer *)
   ((long)&(this->constr_).
           super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_.
           x_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 8) = pdVar5;
  *(pointer *)
   ((long)&(this->constr_).
           super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_.
           x_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 0x10) =
       *(pointer *)
        ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).
                params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data + 0x10);
  *(pointer *)
   ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_
           .plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_.plp_.x_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  *(pointer *)
   ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_
           .plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  pdVar5 = *(pointer *)
            ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                    ).params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data + 8);
  (this->constr_).super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
  params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_.
       plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start;
  *(pointer *)
   ((long)&(this->constr_).
           super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_.
           y_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 8) = pdVar5;
  *(pointer *)
   ((long)&(this->constr_).
           super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_.
           y_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 0x10) =
       *(pointer *)
        ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).
                params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data + 0x10);
  *(pointer *)
   ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_
           .plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_.plp_.y_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  *(pointer *)
   ((long)&(fc->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).params_
           .plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  (this->prepro_).lb_ = -INFINITY;
  (this->prepro_).ub_ = INFINITY;
  (this->prepro_).type_ = CONTINUOUS;
  (this->prepro_).result_var_ = -1;
  return;
}

Assistant:

BasicFCC(Converter& cvt, Constraint&& fc) noexcept :
    converter_(cvt), constr_(std::move(fc)) { }